

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

Result __thiscall wabt::anon_unknown_7::Validator::CheckModule(Validator *this,Module *module)

{
  _func_int **pp_Var1;
  Var *pVVar2;
  Result RVar3;
  char *format;
  ModuleField *pMVar4;
  Location *var_00;
  ModuleField *pMVar5;
  Var *var;
  Var *var_01;
  bool bVar6;
  ModuleField *field;
  undefined1 auStack_98 [8];
  Func *start_func;
  _Manager_type local_88;
  code *pcStack_80;
  pointer local_78;
  pointer local_60;
  ulong local_48;
  TypeChecker *local_40;
  Module *local_38;
  
  this->current_module_ = module;
  this->current_table_index_ = 0;
  this->current_memory_index_ = 0;
  this->current_global_index_ = 0;
  this->num_imported_globals_ = 0;
  this->current_except_index_ = 0;
  pMVar5 = (module->fields).first_;
  local_38 = module;
  if (pMVar5 != (ModuleField *)0x0) {
    local_40 = &this->typechecker_;
    local_48 = 0x3fffffff8;
    bVar6 = false;
    do {
      switch(pMVar5->type_) {
      case Func:
        var_00 = &pMVar5->loc;
        this->current_func_ = (Func *)(pMVar5 + 1);
        CheckFuncSignature(this,var_00,(FuncDeclaration *)&pMVar5[1].loc.filename.size_);
        if (((this->options_->features).multi_value_enabled_ == false) &&
           ((local_48 &
            (long)pMVar5[3].super_intrusive_list_base<wabt::ModuleField>.prev_ -
            (long)pMVar5[3].super_intrusive_list_base<wabt::ModuleField>.next_) != 0)) {
          format = "multiple result values not currently supported.";
LAB_00f68f4e:
          PrintError(this,var_00,format);
        }
        else {
          this->expr_loc_ = var_00;
          TypeChecker::BeginFunction
                    (local_40,(TypeVector *)&pMVar5[3].super_intrusive_list_base<wabt::ModuleField>)
          ;
          ExprVisitor::ExprVisitor((ExprVisitor *)auStack_98,&this->super_Delegate);
          ExprVisitor::VisitExprList
                    ((ExprVisitor *)auStack_98,(ExprList *)((long)&pMVar5[4].loc.field_1 + 8));
          if (local_60 != (pointer)0x0) {
            operator_delete(local_60);
          }
          if (local_78 != (pointer)0x0) {
            operator_delete(local_78);
          }
          if (start_func != (Func *)0x0) {
            operator_delete(start_func);
          }
          TypeChecker::EndFunction(local_40);
          this->current_func_ = (Func *)0x0;
        }
        break;
      case Global:
        CheckConstInitExpr(this,&pMVar5->loc,(ExprList *)&pMVar5[1].loc.field_1.field_0,
                           (Type)pMVar5[1].loc.filename.size_,"global initializer expression");
LAB_00f68f92:
        this->current_global_index_ = this->current_global_index_ + 1;
        break;
      case Import:
        pp_Var1 = pMVar5[1]._vptr_ModuleField;
        if (*(uint *)(pp_Var1 + 9) < 5) {
          switch(*(uint *)(pp_Var1 + 9)) {
          case 0:
            if (*(char *)(pp_Var1 + 0xe) == '\x01') {
              CheckFuncTypeVar(this,(Var *)(pp_Var1 + 0xf),(FuncType **)0x0);
            }
            break;
          case 1:
            pMVar4 = (ModuleField *)(pp_Var1 + 10);
            goto LAB_00f690fa;
          case 2:
            pMVar4 = (ModuleField *)(pp_Var1 + 10);
            goto LAB_00f68f64;
          case 3:
            if ((*(char *)((long)pp_Var1 + 0x74) == '\x01') &&
               ((this->options_->features).mutable_globals_enabled_ == false)) {
              PrintError(this,&pMVar5->loc,"mutable globals cannot be imported");
            }
            this->num_imported_globals_ = this->num_imported_globals_ + 1;
            goto LAB_00f68f92;
          case 4:
            this->current_except_index_ = this->current_except_index_ + 1;
            pMVar4 = (ModuleField *)(pp_Var1 + 10);
            goto LAB_00f69069;
          }
        }
        break;
      case Export:
        switch((int)pMVar5[1].loc.filename.size_) {
        case 0:
          CheckFuncVar(this,(Var *)&pMVar5[1].loc.field_1.field_0,(Func **)0x0);
          break;
        case 1:
          CheckTableVar(this,(Var *)&pMVar5[1].loc.field_1.field_0,(Table **)0x0);
          break;
        case 2:
          CheckMemoryVar(this,(Var *)&pMVar5[1].loc.field_1.field_0,(Memory **)0x0);
          break;
        case 3:
          var_00 = (Location *)&pMVar5[1].loc.field_1;
          RVar3 = CheckGlobalVar(this,(Var *)var_00,(Global **)auStack_98,(Index *)0x0);
          if (((RVar3.enum_ == Ok) && (*(code *)((long)auStack_98 + 0x24) == (code)0x1)) &&
             ((this->options_->features).mutable_globals_enabled_ == false)) {
            format = "mutable globals cannot be exported";
            goto LAB_00f68f4e;
          }
          break;
        case 4:
          CheckExceptVar(this,(Var *)&pMVar5[1].loc.field_1.field_0,(Exception **)0x0);
        }
        break;
      case Table:
        pMVar4 = pMVar5 + 1;
LAB_00f690fa:
        CheckTable(this,&pMVar5->loc,(Table *)pMVar4);
        this->current_table_index_ = this->current_table_index_ + 1;
        break;
      case Memory:
        pMVar4 = pMVar5 + 1;
LAB_00f68f64:
        CheckMemory(this,&pMVar5->loc,(Memory *)pMVar4);
        this->current_memory_index_ = this->current_memory_index_ + 1;
        break;
      case Start:
        if (bVar6) {
          PrintError(this,&pMVar5->loc,"only one start function allowed");
        }
        auStack_98 = (undefined1  [8])0x0;
        if (pMVar5->type_ != Start) {
          __assert_fail("isa<Derived>(base)",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/cast.h"
                        ,0x48,
                        "const Derived *wabt::cast(const Base *) [Derived = wabt::StartModuleField, Base = wabt::ModuleField]"
                       );
        }
        CheckFuncVar(this,(Var *)(pMVar5 + 1),(Func **)auStack_98);
        if (auStack_98 != (undefined1  [8])0x0) {
          if (((long)*(pointer *)((long)auStack_98 + 0x78) -
               (long)(((FuncSignature *)((long)auStack_98 + 0x70))->param_types).
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_start & 0x3fffffffcU) != 0) {
            PrintError(this,&pMVar5->loc,"start function must be nullary");
          }
          if (((long)*(pointer *)((long)auStack_98 + 0x90) -
               (long)(((TypeVector *)((long)auStack_98 + 0x88))->
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                     super__Vector_impl_data._M_start & 0x3fffffffcU) != 0) {
            PrintError(this,&pMVar5->loc,"start function must not return anything");
          }
        }
        bVar6 = true;
        break;
      case Except:
        this->current_except_index_ = this->current_except_index_ + 1;
        pMVar4 = pMVar5 + 1;
LAB_00f69069:
        CheckExcept(this,&pMVar5->loc,(Exception *)pMVar4);
      }
      pMVar5 = (pMVar5->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar5 != (ModuleField *)0x0);
  }
  pMVar5 = (local_38->fields).first_;
  if (pMVar5 != (ModuleField *)0x0) {
    do {
      if (pMVar5->type_ == ElemSegment) {
        pVVar2 = (Var *)pMVar5[3].super_intrusive_list_base<wabt::ModuleField>.prev_;
        for (var_01 = (Var *)pMVar5[3].super_intrusive_list_base<wabt::ModuleField>.next_;
            var_01 != pVVar2; var_01 = var_01 + 1) {
          CheckFuncVar(this,var_01,(Func **)0x0);
        }
        if ((pMVar5[2].loc.field_1.field2[0] == '\0') &&
           (RVar3 = CheckTableVar(this,(Var *)&pMVar5[1].loc.filename.size_,(Table **)auStack_98),
           RVar3.enum_ != Error)) {
          CheckConstInitExpr(this,&pMVar5->loc,(ExprList *)((long)&pMVar5[2].loc.field_1 + 8),I32,
                             "elem segment offset");
        }
      }
      pMVar5 = (pMVar5->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar5 != (ModuleField *)0x0);
  }
  pMVar5 = (local_38->fields).first_;
  if (pMVar5 != (ModuleField *)0x0) {
    do {
      if (((pMVar5->type_ == DataSegment) && (pMVar5[2].loc.field_1.field2[0] == '\0')) &&
         (RVar3 = CheckMemoryVar(this,(Var *)&pMVar5[1].loc.filename.size_,(Memory **)auStack_98),
         RVar3.enum_ != Error)) {
        CheckConstInitExpr(this,&pMVar5->loc,(ExprList *)((long)&pMVar5[2].loc.field_1 + 8),I32,
                           "data segment offset");
      }
      pMVar5 = (pMVar5->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar5 != (ModuleField *)0x0);
  }
  start_func = (Func *)0x0;
  pcStack_80 = std::
               _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/validator.cc:1206:7)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/validator.cc:1206:7)>
             ::_M_manager;
  auStack_98 = (undefined1  [8])this;
  BindingHash::FindDuplicates(&local_38->export_bindings,(DuplicateCallback *)auStack_98);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)auStack_98,(_Any_data *)auStack_98,__destroy_functor);
  }
  return (Result)(this->result_).enum_;
}

Assistant:

Result Validator::CheckModule(const Module* module) {
  bool seen_start = false;

  current_module_ = module;
  current_table_index_ = 0;
  current_memory_index_ = 0;
  current_global_index_ = 0;
  num_imported_globals_ = 0;
  current_except_index_ = 0;

  for (const ModuleField& field : module->fields) {
    switch (field.type()) {
      case ModuleFieldType::Except:
        ++current_except_index_;
        CheckExcept(&field.loc, &cast<ExceptionModuleField>(&field)->except);
        break;

      case ModuleFieldType::Func:
        CheckFunc(&field.loc, &cast<FuncModuleField>(&field)->func);
        break;

      case ModuleFieldType::Global:
        CheckGlobal(&field.loc, &cast<GlobalModuleField>(&field)->global);
        current_global_index_++;
        break;

      case ModuleFieldType::Import:
        CheckImport(&field.loc, cast<ImportModuleField>(&field)->import.get());
        break;

      case ModuleFieldType::Export:
        CheckExport(&field.loc, &cast<ExportModuleField>(&field)->export_);
        break;

      case ModuleFieldType::Table:
        CheckTable(&field.loc, &cast<TableModuleField>(&field)->table);
        current_table_index_++;
        break;

      case ModuleFieldType::ElemSegment:
        // Checked below.
        break;

      case ModuleFieldType::Memory:
        CheckMemory(&field.loc, &cast<MemoryModuleField>(&field)->memory);
        current_memory_index_++;
        break;

      case ModuleFieldType::DataSegment:
        // Checked below.
        break;

      case ModuleFieldType::FuncType:
        break;

      case ModuleFieldType::Start: {
        if (seen_start) {
          PrintError(&field.loc, "only one start function allowed");
        }

        const Func* start_func = nullptr;
        CheckFuncVar(&cast<StartModuleField>(&field)->start, &start_func);
        if (start_func) {
          if (start_func->GetNumParams() != 0) {
            PrintError(&field.loc, "start function must be nullary");
          }

          if (start_func->GetNumResults() != 0) {
            PrintError(&field.loc, "start function must not return anything");
          }
        }
        seen_start = true;
        break;
      }
    }
  }

  CheckElemSegments(module);
  CheckDataSegments(module);
  CheckDuplicateExportBindings(module);

  return result_;
}